

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConcurrentAssertionStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcurrentAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::syntax::ActionBlockSyntax&>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,Token *args_4,
          Token *args_5,PropertySpecSyntax *args_6,Token *args_7,ActionBlockSyntax *args_8)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  ConcurrentAssertionStatementSyntax *this_00;
  
  this_00 = (ConcurrentAssertionStatementSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConcurrentAssertionStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ConcurrentAssertionStatementSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar5 = args_3->kind;
  uVar6 = args_3->field_0x2;
  NVar7.raw = (args_3->numFlags).raw;
  uVar8 = args_3->rawLen;
  pIVar1 = args_3->info;
  TVar9 = args_4->kind;
  uVar10 = args_4->field_0x2;
  NVar11.raw = (args_4->numFlags).raw;
  uVar12 = args_4->rawLen;
  pIVar2 = args_4->info;
  TVar13 = args_5->kind;
  uVar14 = args_5->field_0x2;
  NVar15.raw = (args_5->numFlags).raw;
  uVar16 = args_5->rawLen;
  pIVar3 = args_5->info;
  TVar17 = args_7->kind;
  uVar18 = args_7->field_0x2;
  NVar19.raw = (args_7->numFlags).raw;
  uVar20 = args_7->rawLen;
  pIVar4 = args_7->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,*args,*args_1,args_2);
  (this_00->keyword).kind = TVar5;
  (this_00->keyword).field_0x2 = uVar6;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (this_00->keyword).rawLen = uVar8;
  (this_00->keyword).info = pIVar1;
  (this_00->propertyOrSequence).kind = TVar9;
  (this_00->propertyOrSequence).field_0x2 = uVar10;
  (this_00->propertyOrSequence).numFlags = (NumericTokenFlags)NVar11.raw;
  (this_00->propertyOrSequence).rawLen = uVar12;
  (this_00->propertyOrSequence).info = pIVar2;
  (this_00->openParen).kind = TVar13;
  (this_00->openParen).field_0x2 = uVar14;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (this_00->openParen).rawLen = uVar16;
  (this_00->openParen).info = pIVar3;
  (this_00->propertySpec).ptr = args_6;
  (this_00->closeParen).kind = TVar17;
  (this_00->closeParen).field_0x2 = uVar18;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar19.raw;
  (this_00->closeParen).rawLen = uVar20;
  (this_00->closeParen).info = pIVar4;
  (this_00->action).ptr = args_8;
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_8->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }